

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUtils.h
# Opt level: O0

void generalSolveTest1(int dim,int dl)

{
  pointer *ppdVar1;
  int *piVar2;
  bool bVar3;
  Matrix *pMVar4;
  TriangularSolve *this;
  CSR *this_00;
  TriangularSolve *this_01;
  iterator iVar5;
  iterator iVar6;
  ostream *poVar7;
  CSC *pCVar8;
  reference pdVar9;
  double x_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<double,_std::allocator<double>_> *__range1_3;
  rep_conflict local_2d8;
  double durationSym4;
  rep_conflict local_2c8;
  rep_conflict local_2c0;
  Matrix *local_2b8;
  Matrix *result4;
  int local_2a4;
  Matrix *pMStack_2a0;
  int i_3;
  Matrix *d3;
  double x_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<double,_std::allocator<double>_> *__range1_2;
  rep_conflict local_268;
  double durationSym3;
  rep_conflict local_258;
  rep_conflict local_250;
  Matrix *local_248;
  Matrix *result3;
  int local_234;
  int *piStack_230;
  int i_2;
  int *f;
  Matrix *d2;
  diagonal *d1;
  double x_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<double,_std::allocator<double>_> *__range1_1;
  rep_conflict local_1e8;
  double durationSym2;
  rep_conflict local_1d8;
  rep_conflict local_1d0;
  Matrix *local_1c8;
  Matrix *result2;
  int local_1b4;
  CSC *pCStack_1b0;
  int i_1;
  CSC *cc1;
  double dStack_1a0;
  int nnz;
  double x;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  rep_conflict local_170;
  double durationSym1;
  rep_conflict local_160;
  rep_conflict local_158;
  Matrix *local_150;
  Matrix *result1;
  int local_13c;
  duration<double,_std::ratio<1L,_1L>_> dStack_138;
  int i;
  duration<double,_std::ratio<1L,_1L>_> elapsed_seconds;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  end;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  start;
  TriangularSolve *rs;
  CSR *cr1;
  TriangularSolve *s;
  string local_100;
  Matrix *local_e0;
  Matrix *v1;
  string local_d0;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8;
  Matrix *local_78;
  Matrix *dia;
  vector<double,_std::allocator<double>_> t4;
  vector<double,_std::allocator<double>_> t3;
  vector<double,_std::allocator<double>_> t2;
  vector<double,_std::allocator<double>_> t1;
  int dl_local;
  int dim_local;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &t3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &t4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&dia);
  pMVar4 = (Matrix *)operator_new(0x30);
  local_aa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8," ",&local_a9);
  Matrix::Matrix(pMVar4,dim,dim,&local_a8);
  local_aa = 0;
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  local_78 = pMVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"diagonal",(allocator *)((long)&v1 + 7));
  Matrix::Random(pMVar4,dl,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&v1 + 7));
  Matrix::LowerTriangular(local_78);
  pMVar4 = (Matrix *)operator_new(0x30);
  s._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"rhs",(allocator *)((long)&s + 7));
  Matrix::Matrix(pMVar4,dim,1,&local_100);
  s._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&s + 7));
  local_e0 = pMVar4;
  Matrix::Random(pMVar4);
  this = (TriangularSolve *)operator_new(4);
  TriangularSolve::TriangularSolve(this,dim);
  this_00 = (CSR *)operator_new(0x30);
  CSR::CSR(this_00,local_78);
  this_01 = (TriangularSolve *)operator_new(4);
  TriangularSolve::TriangularSolve(this_01,dim);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&end);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&elapsed_seconds);
  for (local_13c = 0; local_13c < 5; local_13c = local_13c + 1) {
    result1 = (Matrix *)std::chrono::_V2::system_clock::now();
    end.__d.__r = (duration)(duration)result1;
    local_150 = TriangularSolve::solve(this,this_00,local_e0);
    local_158 = (rep_conflict)std::chrono::_V2::system_clock::now();
    elapsed_seconds.__r = local_158;
    durationSym1 = (double)std::chrono::operator-
                                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)&elapsed_seconds,&end);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_160,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)&durationSym1);
    dStack_138.__r = local_160;
    local_170 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&stack0xfffffffffffffec8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_170);
    pMVar4 = local_150;
    if (local_150 != (Matrix *)0x0) {
      Matrix::~Matrix(local_150);
      operator_delete(pMVar4,0x30);
    }
  }
  ppdVar1 = &t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar5 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)ppdVar1);
  iVar6 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)ppdVar1);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar5._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar6._M_current);
  poVar7 = std::operator<<((ostream *)&std::cout,"solve(CSR)");
  std::operator<<(poVar7,",");
  ppdVar1 = &t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  __end1 = std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)ppdVar1);
  x = (double)std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)ppdVar1);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&x);
    if (!bVar3) break;
    pdVar9 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    dStack_1a0 = *pdVar9;
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dStack_1a0);
    std::operator<<(poVar7,",");
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  cc1._4_4_ = CSR::turntoCSC(this_00);
  pCVar8 = (CSC *)operator_new(0x30);
  CSC::CSC(pCVar8,dim,dim,cc1._4_4_,this_00->ptr,this_00->idx,this_00->val);
  pCStack_1b0 = pCVar8;
  for (local_1b4 = 0; local_1b4 < 5; local_1b4 = local_1b4 + 1) {
    result2 = (Matrix *)std::chrono::_V2::system_clock::now();
    end.__d.__r = (duration)(duration)result2;
    local_1c8 = TriangularSolve::solve(this,pCStack_1b0,local_e0);
    local_1d0 = (rep_conflict)std::chrono::_V2::system_clock::now();
    elapsed_seconds.__r = local_1d0;
    durationSym2 = (double)std::chrono::operator-
                                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)&elapsed_seconds,&end);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_1d8,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)&durationSym2);
    dStack_138.__r = local_1d8;
    local_1e8 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&stack0xfffffffffffffec8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &t3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_1e8);
    pMVar4 = local_1c8;
    if (local_1c8 != (Matrix *)0x0) {
      Matrix::~Matrix(local_1c8);
      operator_delete(pMVar4,0x30);
    }
  }
  ppdVar1 = &t3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar5 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)ppdVar1);
  iVar6 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)ppdVar1);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar5._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar6._M_current);
  poVar7 = std::operator<<((ostream *)&std::cout,"solve(CSC)");
  std::operator<<(poVar7,",");
  ppdVar1 = &t3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  __end1_1 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)ppdVar1);
  x_1 = (double)std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)ppdVar1);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&x_1);
    if (!bVar3) break;
    pdVar9 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1_1);
    d1 = (diagonal *)*pdVar9;
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(double)d1);
    std::operator<<(poVar7,",");
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  pMVar4 = (Matrix *)operator_new(0x18);
  diagonal::diagonal((diagonal *)pMVar4,dim,dim,dl);
  d2 = pMVar4;
  f = &diagonal::diaStore((diagonal *)pMVar4,local_78,1)->rowNo;
  piStack_230 = diagonal::offsetCompute((diagonal *)d2,1);
  for (local_234 = 0; local_234 < 5; local_234 = local_234 + 1) {
    result3 = (Matrix *)std::chrono::_V2::system_clock::now();
    end.__d.__r = (duration)(duration)result3;
    local_248 = TriangularSolve::solved1(this,(Matrix *)f,local_e0,dl);
    local_250 = (rep_conflict)std::chrono::_V2::system_clock::now();
    elapsed_seconds.__r = local_250;
    durationSym3 = (double)std::chrono::operator-
                                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)&elapsed_seconds,&end);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_258,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)&durationSym3);
    dStack_138.__r = local_258;
    local_268 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&stack0xfffffffffffffec8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &t4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_268);
    pMVar4 = local_248;
    if (local_248 != (Matrix *)0x0) {
      Matrix::~Matrix(local_248);
      operator_delete(pMVar4,0x30);
    }
  }
  ppdVar1 = &t4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar5 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)ppdVar1);
  iVar6 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)ppdVar1);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar5._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar6._M_current);
  poVar7 = std::operator<<((ostream *)&std::cout,"solve(dia1)");
  std::operator<<(poVar7,",");
  ppdVar1 = &t4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  __end1_2 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)ppdVar1);
  x_2 = (double)std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)ppdVar1);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&x_2);
    if (!bVar3) break;
    pdVar9 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1_2);
    d3 = (Matrix *)*pdVar9;
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(double)d3);
    std::operator<<(poVar7,",");
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_2);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  pMStack_2a0 = diagonal::diaStore2((diagonal *)d2,local_78,1);
  for (local_2a4 = 0; local_2a4 < 5; local_2a4 = local_2a4 + 1) {
    result4 = (Matrix *)std::chrono::_V2::system_clock::now();
    end.__d.__r = (duration)(duration)result4;
    local_2b8 = TriangularSolve::solve(this,pMStack_2a0,local_e0,dl);
    local_2c0 = (rep_conflict)std::chrono::_V2::system_clock::now();
    elapsed_seconds.__r = local_2c0;
    durationSym4 = (double)std::chrono::operator-
                                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)&elapsed_seconds,&end);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_2c8,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)&durationSym4);
    dStack_138.__r = local_2c8;
    local_2d8 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&stack0xfffffffffffffec8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&dia,&local_2d8);
    pMVar4 = local_2b8;
    if (local_2b8 != (Matrix *)0x0) {
      Matrix::~Matrix(local_2b8);
      operator_delete(pMVar4,0x30);
    }
  }
  iVar5 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)&dia);
  iVar6 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)&dia);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar5._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar6._M_current);
  poVar7 = std::operator<<((ostream *)&std::cout,"solve(dia2)");
  std::operator<<(poVar7,",");
  __end1_3 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)&dia);
  x_3 = (double)std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)&dia);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_3,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&x_3);
    if (!bVar3) break;
    pdVar9 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1_3);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pdVar9);
    std::operator<<(poVar7,",");
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_3);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  pMVar4 = local_78;
  if (local_78 != (Matrix *)0x0) {
    Matrix::~Matrix(local_78);
    operator_delete(pMVar4,0x30);
  }
  pMVar4 = local_e0;
  if (local_e0 != (Matrix *)0x0) {
    Matrix::~Matrix(local_e0);
    operator_delete(pMVar4,0x30);
  }
  if (this != (TriangularSolve *)0x0) {
    TriangularSolve::~TriangularSolve(this);
    operator_delete(this,4);
  }
  if (this_00 != (CSR *)0x0) {
    CSR::~CSR(this_00);
    operator_delete(this_00,0x30);
  }
  if (this_01 != (TriangularSolve *)0x0) {
    TriangularSolve::~TriangularSolve(this_01);
    operator_delete(this_01,4);
  }
  pCVar8 = pCStack_1b0;
  if (pCStack_1b0 != (CSC *)0x0) {
    CSC::~CSC(pCStack_1b0);
    operator_delete(pCVar8,0x30);
  }
  pMVar4 = d2;
  if (d2 != (Matrix *)0x0) {
    diagonal::~diagonal((diagonal *)d2);
    operator_delete(pMVar4,0x18);
  }
  piVar2 = f;
  if (f != (int *)0x0) {
    Matrix::~Matrix((Matrix *)f);
    operator_delete(piVar2,0x30);
  }
  pMVar4 = pMStack_2a0;
  if (pMStack_2a0 != (Matrix *)0x0) {
    Matrix::~Matrix(pMStack_2a0);
    operator_delete(pMVar4,0x30);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&dia);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &t4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &t3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  return;
}

Assistant:

void generalSolveTest1(int dim, int dl)

{
// 7 for col and row - 4 for diagonal
    vector<double> t1;
    vector<double> t2;
    vector<double> t3;
    vector<double> t4;
    Matrix *dia = new Matrix(dim,dim," ");
    dia->Random(dl,"diagonal");
    dia->LowerTriangular();
    // dia->print();
   // Matrix *v1 = dia->addTest(); // for testing vOne
    //v1->print();
   // Matrix *vOne = new Matrix(dim,1,"v for test"); // for testing with vOne
   // vOne->One();
     Matrix *v1 = new Matrix(dim, 1, "rhs");
     v1->Random();
    // v1->print();

    TriangularSolve *s = new TriangularSolve(dim);

//csrSolve
    CSR *cr1 = new CSR(dia);
    TriangularSolve *rs = new TriangularSolve(dim);//dim:row numbers
    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result1 = s->solve(cr1,v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym1 = elapsed_seconds.count();
        // cout << "execution time (CSR Solve):" << durationSym1 << "\n";
        // result1->print();
        t1.push_back(durationSym1);
        delete result1;
    }
    sort(t1.begin(), t1.end());
    cout << "solve(CSR)"<<",";
    for (auto x : t1)
        cout << x << ",";
    cout<<"\n";

    //csr Solve,Test
    // Matrix *rs2 = cr1->csrMult(result1);
    //   rs3->print();
    // bool r1 = rs2->isequal(v1);
    //  cout<<"Testing solve (CSR): "<<r1 <<"\n";

//CSC solve
    int nnz = cr1->turntoCSC();
    CSC *cc1 = new CSC(dim, dim, nnz, cr1->ptr, cr1->idx, cr1->val);

    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result2 = s->solve(cc1,v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym2 = elapsed_seconds.count();
        //cout << "execution time (CSC Solve):" << durationSym2 << "\n";
        //result2->print();
        t2.push_back(durationSym2);
        delete result2;
    }
    sort(t2.begin(),t2.end());
    cout << "solve(CSC)"<<",";
    for(auto x:t2)
        cout<<x<<",";
    cout<<"\n";
    //csc Solve,Test
    //Matrix *mcc2 = cc1->cscMult(result2);
    //  mcc2->print();
    // bool r2 = mcc2->isequal(v1);
    //  cout<<"Testing solve (CSC) is: "<<r2 <<"\n";

    //dia1
    diagonal *d1 = new diagonal(dim,dim,dl);
    Matrix *d2 = d1->diaStore(dia,1);//1 for Lower Triangular Matrix
    // d2->print();
    int *f = d1->offsetCompute(1);//1 for Lower Triangular Matrix

    // TriangularSolve *d = new TriangularSolve(100);//n:row number
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result3 = s->solved1(d2,v1,dl);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym3 = elapsed_seconds.count();
        //cout << "execution time (diagonal1 Solve):" << durationSym3 << "\n";
        // result3->print();
        t3.push_back(durationSym3);
        delete result3;
    }
    sort(t3.begin(), t3.end());
    cout << "solve(dia1)"<<",";
    for(auto x:t3)
        cout<<x<<",";
    cout<<"\n";
    //test
    //Matrix *ts1 = d1->diaMult(d2,result3);
    // bool r3 = ts1->isequal(v1);
    // cout<<"testing solve(dia1): "<<r3<<"\n";

//dia2

    Matrix *d3 = d1->diaStore2(dia,1);
    //d3->print();
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result4 = s->solve(d3,v1,dl);//number of diagonals
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym4 = elapsed_seconds.count();
        // cout << "execution time (diagonal2 Solve):" << durationSym4 << "\n";
        // result4->print();
        t4.push_back(durationSym4);
        delete result4;
    }
    sort(t4.begin(), t4.end());
    cout << "solve(dia2)"<<",";
    for(auto x:t4)
        cout<<x<<",";
    cout<<"\n";
    //test
    //Matrix *ts2 = d1->diaMult2(d3,result4);
    // bool r4 = ts2->isequal(v1);
    // cout<<"testing solve(dia2): "<<r4<<"\n";

    //comparing dia1 and dia2 solve
    /* bool r5 = result3->isequal(result4);
     bool r6 = result1->isequal(result2);
     bool r7 = result2->isequal(result3);
     cout<<"dia1&dia2&csr&csc: "<<r5<< ","<< r6 << ","<< r7<<"\n";

     cout<<"test with  vector One:"<<"\n";
     bool r10 = result1->isequal(vOne);
     bool r11 = result2->isequal(vOne);
     bool r12 = result3->isequal(vOne);
     bool r13 = result4->isequal(vOne);
     cout<<"dia1&dia2&csr&csc: "<<r10<< ","<< r11 << ","<< r12<<","<< r13<<"\n";*/

    delete dia;
    delete v1;
    delete s;
    delete cr1;
    delete rs;
    delete cc1;
    delete d1;
    delete d2;
    delete d3;


    // delete rs2;
//    delete cs;
    //  delete result1;
    // delete mcc2;
    //  delete d;
    // delete result3;
    //  delete ts1;
    //  delete result4;
    // delete ts2;

}